

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void __thiscall absl::CondVar::Remove(CondVar *this,PerThreadSynch *s)

{
  ulong uVar1;
  ulong uVar2;
  int c;
  PerThreadSynch *pPVar3;
  PerThreadSynch *pPVar4;
  PerThreadSynch *pPVar5;
  
  c = 0;
  do {
    uVar2 = *(ulong *)this;
    if ((uVar2 & 1) == 0) {
      LOCK();
      uVar1 = *(ulong *)this;
      if (uVar2 == uVar1) {
        *(ulong *)this = uVar2 | 1;
      }
      UNLOCK();
      if (uVar2 == uVar1) break;
    }
    c = synchronization_internal::MutexDelay(c,1);
  } while( true );
  pPVar3 = (PerThreadSynch *)(uVar2 & 0xfffffffffffffffc);
  pPVar5 = pPVar3;
  if (pPVar3 == (PerThreadSynch *)0x0) {
    pPVar3 = (PerThreadSynch *)0x0;
  }
  else {
    do {
      pPVar4 = pPVar5;
      pPVar5 = pPVar4->next;
      if (pPVar5 == s) break;
    } while (pPVar5 != pPVar3);
    if (pPVar5 == s) {
      pPVar5 = (PerThreadSynch *)0x0;
      if (pPVar4 != s) {
        pPVar5 = pPVar4;
      }
      pPVar4->next = s->next;
      if (pPVar3 == s) {
        pPVar3 = pPVar5;
      }
      s->next = (PerThreadSynch *)0x0;
      (s->state)._M_i = kAvailable;
    }
  }
  *(ulong *)this = (ulong)((uint)uVar2 & 2) | (ulong)pPVar3;
  return;
}

Assistant:

void CondVar::Remove(PerThreadSynch* s) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  intptr_t v;
  int c = 0;
  for (v = cv_.load(std::memory_order_relaxed);;
       v = cv_.load(std::memory_order_relaxed)) {
    if ((v & kCvSpin) == 0 &&  // attempt to acquire spinlock
        cv_.compare_exchange_strong(v, v | kCvSpin, std::memory_order_acquire,
                                    std::memory_order_relaxed)) {
      PerThreadSynch* h = reinterpret_cast<PerThreadSynch*>(v & ~kCvLow);
      if (h != nullptr) {
        PerThreadSynch* w = h;
        while (w->next != s && w->next != h) {  // search for thread
          w = w->next;
        }
        if (w->next == s) {  // found thread; remove it
          w->next = s->next;
          if (h == s) {
            h = (w == s) ? nullptr : w;
          }
          s->next = nullptr;
          s->state.store(PerThreadSynch::kAvailable, std::memory_order_release);
        }
      }
      // release spinlock
      cv_.store((v & kCvEvent) | reinterpret_cast<intptr_t>(h),
                std::memory_order_release);
      return;
    } else {
      // try again after a delay
      c = synchronization_internal::MutexDelay(c, GENTLE);
    }
  }
}